

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cc
# Opt level: O2

void __thiscall RigidBodyDynamics::Model::Model(Model *this)

{
  _Rb_tree_header *p_Var1;
  mapped_type *pmVar2;
  Joint root_joint;
  Body root_body;
  value_type local_298;
  value_type local_248;
  undefined1 local_228 [32];
  double local_208;
  double local_200;
  double local_1e8;
  DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  local_108 [8];
  undefined8 local_100;
  value_type local_f8;
  Body local_a0;
  
  (this->mBodies).
  super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>.
  super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->mBodies).
  super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>.
  super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mBodies).
  super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>.
  super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mBodyNameMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->mBodyNameMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->lambda).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->lambda).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->lambda).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->lambda_q).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->lambda_q).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->lambda_q).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->mu).
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mu).
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mu).
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->mBodyNameMap)._M_t._M_impl.super__Rb_tree_header;
  memset(&this->v,0,0x2c0);
  (this->mBodyNameMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->mBodyNameMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->mBodyNameMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  Body::Body(&local_a0);
  local_248.mJointAxes = (SpatialVector *)0x0;
  local_248.mJointType = JointTypeUndefined;
  local_248.mDoFCount = 0;
  local_248.q_index = 0;
  local_248.custom_joint_index = 0xffffffff;
  local_298.super_Matrix<double,_6,_1,_0,_6,_1>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] = 0.0;
  local_298.super_Matrix<double,_6,_1,_0,_6,_1>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] = 0.0;
  local_298.super_Matrix<double,_6,_1,_0,_6,_1>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] = 0.0;
  local_298.super_Matrix<double,_6,_1,_0,_6,_1>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] = 0.0;
  local_298.super_Matrix<double,_6,_1,_0,_6,_1>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] = 0.0;
  local_298.super_Matrix<double,_6,_1,_0,_6,_1>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] = 0.0;
  local_228._0_4_ = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&this->lambda,(uint *)local_228);
  local_228._0_8_ = (ulong)(uint)local_228._4_4_ << 0x20;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&this->lambda_q,(uint *)local_228);
  local_228._0_8_ = (pointer)0x0;
  local_228._8_8_ = (pointer)0x0;
  local_228._16_8_ = (pointer)0x0;
  std::
  vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
  ::emplace_back<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              *)&this->mu,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_228);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)local_228);
  (this->gravity).super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
  m_storage.m_data.array[0] = 0.0;
  this->dof_count = 0;
  this->q_size = 0;
  this->qdot_size = 0;
  this->previously_added_body_id = 0;
  (this->gravity).super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
  m_storage.m_data.array[1] = -9.81;
  (this->gravity).super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
  m_storage.m_data.array[2] = 0.0;
  std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::push_back
            (&(this->v).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>,
             &local_298);
  std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::push_back
            (&(this->a).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>,
             &local_298);
  std::vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>::
  push_back(&(this->mJoints).
             super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
            ,&local_248);
  std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::push_back
            (&(this->S).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>,
             &local_298);
  Math::SpatialTransform::SpatialTransform((SpatialTransform *)local_228);
  std::
  vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
  ::emplace_back<RigidBodyDynamics::Math::SpatialTransform>
            (&(this->X_T).
              super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
             ,(SpatialTransform *)local_228);
  Math::SpatialTransform::SpatialTransform((SpatialTransform *)local_228);
  std::
  vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
  ::emplace_back<RigidBodyDynamics::Math::SpatialTransform>
            (&(this->X_J).
              super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
             ,(SpatialTransform *)local_228);
  std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::push_back
            (&(this->v_J).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>,
             &local_298);
  std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::push_back
            (&(this->c_J).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>,
             &local_298);
  local_f8.h.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
  m_data.array[0] = 0.0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,6,3,0,6,3>>::
  _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,6,3,0,6,3>>>
            ((PlainObjectBase<Eigen::Matrix<double,6,3,0,6,3>> *)local_228,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
              *)&local_f8);
  std::
  vector<Eigen::Matrix<double,6,3,0,6,3>,Eigen::aligned_allocator<Eigen::Matrix<double,6,3,0,6,3>>>
  ::emplace_back<Eigen::Matrix<double,6,3,0,6,3>>
            ((vector<Eigen::Matrix<double,6,3,0,6,3>,Eigen::aligned_allocator<Eigen::Matrix<double,6,3,0,6,3>>>
              *)&this->multdof3_S,(Matrix<double,_6,_3,_0,_6,_3> *)local_228);
  local_f8.h.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
  m_data.array[0] = 0.0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,6,3,0,6,3>>::
  _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,6,3,0,6,3>>>
            ((PlainObjectBase<Eigen::Matrix<double,6,3,0,6,3>> *)local_228,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
              *)&local_f8);
  std::
  vector<Eigen::Matrix<double,6,3,0,6,3>,Eigen::aligned_allocator<Eigen::Matrix<double,6,3,0,6,3>>>
  ::emplace_back<Eigen::Matrix<double,6,3,0,6,3>>
            ((vector<Eigen::Matrix<double,6,3,0,6,3>,Eigen::aligned_allocator<Eigen::Matrix<double,6,3,0,6,3>>>
              *)&this->multdof3_U,(Matrix<double,_6,_3,_0,_6,_3> *)local_228);
  local_f8.h.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
  m_data.array[0] = 0.0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>>::
  _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>>>
            ((PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)local_228,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              *)&local_f8);
  std::vector<Matrix3_t,_std::allocator<Matrix3_t>_>::emplace_back<Matrix3_t>
            (&this->multdof3_Dinv,(Matrix3_t *)local_228);
  local_f8.h.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
  m_data.array[0] = 0.0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)local_228,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)&local_f8);
  std::vector<Vector3_t,_std::allocator<Vector3_t>_>::emplace_back<Vector3_t>
            (&this->multdof3_u,(Vector3_t *)local_228);
  local_228._0_8_ = local_228._0_8_ & 0xffffffff00000000;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&this->multdof3_w_index,(uint *)local_228);
  std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::push_back
            (&(this->c).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>,
             &local_298);
  Eigen::PlainObjectBase<Eigen::Matrix<double,6,6,0,6,6>>::
  _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,6,6,0,6,6>>>
            ((PlainObjectBase<Eigen::Matrix<double,6,6,0,6,6>> *)local_228,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_6,_6,_0,_6,_6>_>_>
              *)&local_f8);
  std::vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>::
  emplace_back<SpatialMatrix_t>
            (&(this->IA).super_vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>,
             (SpatialMatrix_t *)local_228);
  std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::push_back
            (&(this->pA).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>,
             &local_298);
  std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::push_back
            (&(this->U).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>,
             &local_298);
  local_228._0_8_ = (pointer)0x1;
  local_228._16_8_ = (pointer)0x0;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            (&this->u,(CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                       *)local_228);
  local_228._0_8_ = (pointer)0x1;
  local_228._16_8_ = (pointer)0x0;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            (&this->d,(CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                       *)local_228);
  std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::push_back
            (&(this->f).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>,
             &local_298);
  local_100 = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>>::
  _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>>>
            ((PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)local_228,local_108);
  local_f8.h.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
  m_data.array[1] = 0.0;
  local_f8.h.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
  m_data.array[2] = 0.0;
  local_f8.m = 0.0;
  local_f8.h.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
  m_data.array[0] = 0.0;
  local_f8.Ixx = (Scalar)local_228._0_8_;
  local_f8.Iyx = (Scalar)local_228._8_8_;
  local_f8.Iyy = local_208;
  local_f8.Izx = (Scalar)local_228._16_8_;
  local_f8.Izy = local_200;
  local_f8.Izz = local_1e8;
  std::
  vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
  ::push_back(&(this->Ic).
               super_vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
              ,&local_f8);
  std::
  vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
  ::push_back(&(this->I).
               super_vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
              ,&local_f8);
  std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::push_back
            (&(this->hc).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>,
             &local_298);
  std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::push_back
            (&(this->hdotc).
              super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>,&local_298);
  Math::SpatialTransform::SpatialTransform((SpatialTransform *)local_228);
  std::
  vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
  ::emplace_back<RigidBodyDynamics::Math::SpatialTransform>
            (&(this->X_lambda).
              super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
             ,(SpatialTransform *)local_228);
  Math::SpatialTransform::SpatialTransform((SpatialTransform *)local_228);
  std::
  vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
  ::emplace_back<RigidBodyDynamics::Math::SpatialTransform>
            (&(this->X_base).
              super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
             ,(SpatialTransform *)local_228);
  std::vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>::
  push_back(&(this->mBodies).
             super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
            ,&local_a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_228,"ROOT",(allocator<char> *)local_108);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&this->mBodyNameMap,(key_type *)local_228);
  *pmVar2 = 0;
  std::__cxx11::string::~string((string *)local_228);
  this->fixed_body_discriminator = 0x7fffffff;
  Joint::~Joint(&local_248);
  return;
}

Assistant:

Model::Model()
{
  Body root_body;
  Joint root_joint;

  Vector3d zero_position (0., 0., 0.);
  SpatialVector zero_spatial (0., 0., 0., 0., 0., 0.);

  // structural information
  lambda.push_back(0);
  lambda_q.push_back(0);
  mu.push_back(std::vector<unsigned int>());
  dof_count = 0;
  q_size = 0;
  qdot_size = 0;
  previously_added_body_id = 0;

  gravity = Vector3d (0., -9.81, 0.);

  // state information
  v.push_back(zero_spatial);
  a.push_back(zero_spatial);

  // Joints
  mJoints.push_back(root_joint);
  S.push_back (zero_spatial);
  X_T.push_back(SpatialTransform());

  X_J.push_back (SpatialTransform());
  v_J.push_back (zero_spatial);
  c_J.push_back (zero_spatial);

  // Spherical joints
  multdof3_S.push_back (Matrix63::Zero());
  multdof3_U.push_back (Matrix63::Zero());
  multdof3_Dinv.push_back (Matrix3d::Zero());
  multdof3_u.push_back (Vector3d::Zero());
  multdof3_w_index.push_back (0);

  // Dynamic variables
  c.push_back(zero_spatial);
  IA.push_back(SpatialMatrix::Identity());
  pA.push_back(zero_spatial);
  U.push_back(zero_spatial);

  u = VectorNd::Zero(1);
  d = VectorNd::Zero(1);

  f.push_back (zero_spatial);
  SpatialRigidBodyInertia rbi(0.,
                              Vector3d (0., 0., 0.),
                              Matrix3d::Zero());
  Ic.push_back (rbi);
  I.push_back(rbi);
  hc.push_back (zero_spatial);
  hdotc.push_back (zero_spatial);

  // Bodies
  X_lambda.push_back(SpatialTransform());
  X_base.push_back(SpatialTransform());

  mBodies.push_back(root_body);
  mBodyNameMap["ROOT"] = 0;

  fixed_body_discriminator = std::numeric_limits<unsigned int>::max() / 2;
}